

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O3

uint8_t * apx_signatureParser_parse_limits_u64
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint64_t upper_limit;
  uint64_t lower_limit;
  uint64_t local_30;
  uint64_t local_28;
  
  if ((begin < end) && (*begin == '(')) {
    puVar1 = bstr_lstrip(begin + 1,end);
    if (((puVar1 < end) &&
        (((puVar2 = apx_parserBase_parse_u64(puVar1,end,&local_28), puVar1 < puVar2 &&
          (puVar1 = bstr_lstrip(puVar2,end), puVar1 < end)) && (*puVar1 == ',')))) &&
       ((puVar1 = bstr_lstrip(puVar1 + 1,end), puVar1 < end &&
        (puVar2 = apx_parserBase_parse_u64(puVar1,end,&local_30), puVar1 < puVar2)))) {
      apx_dataElement_set_limits_uint64(self->state->data_element,local_28,local_30);
      puVar1 = bstr_lstrip(puVar2,end);
      if (puVar1 < end) {
        if (*puVar1 != ')') {
          return (uint8_t *)0x0;
        }
        return puVar1 + 1;
      }
    }
    begin = (uint8_t *)0x0;
  }
  return begin;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_limits_u64(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   if (next < end)
   {
      uint8_t const* result = NULL;
      if (*next++ != '(')
      {
         return begin;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      uint64_t lower_limit, upper_limit;
      result = apx_parserBase_parse_u64(next, end, &lower_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ',')
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      result = apx_parserBase_parse_u64(next, end, &upper_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      apx_dataElement_set_limits_uint64(self->state->data_element, lower_limit, upper_limit);
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ')')
      {
         return NULL;
      }
      return next;
   }
   return begin;
}